

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  bool bVar2;
  ulong uVar3;
  xpath_ast_node *lhs_00;
  xpath_ast_node *pxVar4;
  binary_op_t bVar5;
  binary_op_t bVar6;
  
  lexer = &this->_lexer;
  bVar5 = binary_op_t::parse(lexer);
  do {
    if (bVar5.asttype == ast_unknown) {
      return lhs;
    }
    if (bVar5.precedence < limit) {
      return lhs;
    }
    xpath_lexer::next(lexer);
    uVar3 = this->_depth + 1;
    this->_depth = uVar3;
    if (0x400 < uVar3) {
      pxVar1 = this->_result;
      pxVar1->error = "Exceeded maximum allowed query depth";
      pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
      return (xpath_ast_node *)0x0;
    }
    for (lhs_00 = parse_path_or_unary_expression(this); lhs_00 != (xpath_ast_node *)0x0;
        lhs_00 = parse_expression_rec(this,lhs_00,bVar6.precedence)) {
      bVar6 = binary_op_t::parse(lexer);
      if ((bVar6.asttype == ast_unknown) || (bVar6.precedence <= bVar5.precedence)) {
        if ((bVar5.asttype != ast_op_union) ||
           ((lhs->_rettype == '\x01' && (lhs_00->_rettype == '\x01')))) {
          pxVar4 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar4 == (xpath_ast_node *)0x0) {
            lhs = (xpath_ast_node *)0x0;
          }
          else {
            pxVar4->_type = (char)bVar5.asttype;
            pxVar4->_rettype = (char)bVar5.rettype;
            pxVar4->_axis = '\0';
            pxVar4->_test = '\0';
            pxVar4->_left = lhs;
            pxVar4->_right = lhs_00;
            pxVar4->_next = (xpath_ast_node *)0x0;
            lhs = pxVar4;
          }
          if (lhs == (xpath_ast_node *)0x0) {
            bVar2 = false;
            lhs = (xpath_ast_node *)0x0;
          }
          else {
            bVar5 = binary_op_t::parse(lexer);
            bVar2 = true;
          }
          goto LAB_0070e298;
        }
        pxVar1 = this->_result;
        pxVar1->error = "Union operator has to be applied to node sets";
        pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        break;
      }
    }
    bVar2 = false;
LAB_0070e298:
    if (!bVar2) {
      return (xpath_ast_node *)0x0;
    }
  } while( true );
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				if (++_depth > xpath_ast_depth_limit)
					return error_rec();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return NULL;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return NULL;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return NULL;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}